

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

ptr<Expression> __thiscall Parser::comparison(Parser *this)

{
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  Parser *in_RSI;
  ptr<Expression> pVar3;
  undefined1 local_f0 [48];
  undefined1 local_c0 [48];
  undefined1 local_90 [48];
  undefined1 local_60 [80];
  Parser *this_local;
  ptr<Expression> *expr;
  
  local_60[0x47] = '\0';
  this_local = this;
  term(this);
  bVar1 = match(in_RSI,LThan);
  if (bVar1) {
    consume(in_RSI);
    make<LessThan>();
    comparison((Parser *)local_60);
    make<BinaryOperator,std::shared_ptr<LessThan>,std::shared_ptr<Expression>&,std::shared_ptr<Expression>>
              ((shared_ptr<LessThan> *)(local_60 + 0x20),(shared_ptr<Expression> *)(local_60 + 0x10)
               ,(shared_ptr<Expression> *)this);
    std::shared_ptr<Expression>::operator=
              ((shared_ptr<Expression> *)this,(shared_ptr<BinaryOperator> *)(local_60 + 0x20));
    std::shared_ptr<BinaryOperator>::~shared_ptr((shared_ptr<BinaryOperator> *)(local_60 + 0x20));
    std::shared_ptr<Expression>::~shared_ptr((shared_ptr<Expression> *)local_60);
    std::shared_ptr<LessThan>::~shared_ptr((shared_ptr<LessThan> *)(local_60 + 0x10));
    _Var2._M_pi = extraout_RDX;
  }
  else {
    bVar1 = match(in_RSI,LThanEqu);
    if (bVar1) {
      consume(in_RSI);
      make<LessThanOrEqual>();
      comparison((Parser *)local_90);
      make<BinaryOperator,std::shared_ptr<LessThanOrEqual>,std::shared_ptr<Expression>&,std::shared_ptr<Expression>>
                ((shared_ptr<LessThanOrEqual> *)(local_90 + 0x20),
                 (shared_ptr<Expression> *)(local_90 + 0x10),(shared_ptr<Expression> *)this);
      std::shared_ptr<Expression>::operator=
                ((shared_ptr<Expression> *)this,(shared_ptr<BinaryOperator> *)(local_90 + 0x20));
      std::shared_ptr<BinaryOperator>::~shared_ptr((shared_ptr<BinaryOperator> *)(local_90 + 0x20));
      std::shared_ptr<Expression>::~shared_ptr((shared_ptr<Expression> *)local_90);
      std::shared_ptr<LessThanOrEqual>::~shared_ptr
                ((shared_ptr<LessThanOrEqual> *)(local_90 + 0x10));
      _Var2._M_pi = extraout_RDX_00;
    }
    else {
      bVar1 = match(in_RSI,GThanEqu);
      if (bVar1) {
        consume(in_RSI);
        make<GreaterThan>();
        comparison((Parser *)local_c0);
        make<BinaryOperator,std::shared_ptr<GreaterThan>,std::shared_ptr<Expression>&,std::shared_ptr<Expression>>
                  ((shared_ptr<GreaterThan> *)(local_c0 + 0x20),
                   (shared_ptr<Expression> *)(local_c0 + 0x10),(shared_ptr<Expression> *)this);
        std::shared_ptr<Expression>::operator=
                  ((shared_ptr<Expression> *)this,(shared_ptr<BinaryOperator> *)(local_c0 + 0x20));
        std::shared_ptr<BinaryOperator>::~shared_ptr
                  ((shared_ptr<BinaryOperator> *)(local_c0 + 0x20));
        std::shared_ptr<Expression>::~shared_ptr((shared_ptr<Expression> *)local_c0);
        std::shared_ptr<GreaterThan>::~shared_ptr((shared_ptr<GreaterThan> *)(local_c0 + 0x10));
        _Var2._M_pi = extraout_RDX_01;
      }
      else {
        bVar1 = match(in_RSI,GThanEqu);
        _Var2._M_pi = extraout_RDX_02;
        if (bVar1) {
          consume(in_RSI);
          make<GreaterThanOrEqual>();
          comparison((Parser *)local_f0);
          make<BinaryOperator,std::shared_ptr<GreaterThanOrEqual>,std::shared_ptr<Expression>&,std::shared_ptr<Expression>>
                    ((shared_ptr<GreaterThanOrEqual> *)(local_f0 + 0x20),
                     (shared_ptr<Expression> *)(local_f0 + 0x10),(shared_ptr<Expression> *)this);
          std::shared_ptr<Expression>::operator=
                    ((shared_ptr<Expression> *)this,(shared_ptr<BinaryOperator> *)(local_f0 + 0x20))
          ;
          std::shared_ptr<BinaryOperator>::~shared_ptr
                    ((shared_ptr<BinaryOperator> *)(local_f0 + 0x20));
          std::shared_ptr<Expression>::~shared_ptr((shared_ptr<Expression> *)local_f0);
          std::shared_ptr<GreaterThanOrEqual>::~shared_ptr
                    ((shared_ptr<GreaterThanOrEqual> *)(local_f0 + 0x10));
          _Var2._M_pi = extraout_RDX_03;
        }
      }
    }
  }
  pVar3.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  pVar3.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Expression>)pVar3.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Expression> Parser::comparison() {
    ptr<Expression> expr = term();

    if(match(TokenType::LThan)) {
        consume();
        expr = make<BinaryOperator>(make<LessThan>(), expr, comparison());
    } else if(match(TokenType::LThanEqu)) {
        consume();
        expr = make<BinaryOperator>(make<LessThanOrEqual>(), expr, comparison());
    } else if(match(TokenType::GThanEqu)) {
        consume();
        expr = make<BinaryOperator>(make<GreaterThan>(), expr, comparison());
    } else if(match(TokenType::GThanEqu)) {
        consume();
        expr = make<BinaryOperator>(make<GreaterThanOrEqual>(), expr, comparison());
    }

    return expr;
}